

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O3

size_t vx__vertex_hash(vx_vertex_t pos,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar6 = pos.field_0._0_4_ * 7.38561e+07;
  uVar1 = (ulong)fVar6;
  fVar4 = pos.field_0._4_4_ * 19349664.0;
  uVar2 = (ulong)fVar4;
  fVar5 = pos.field_0._8_4_ * 8.349279e+07;
  uVar3 = (ulong)fVar5;
  return (((long)uVar3 >> 0x3f & (long)(fVar5 - 9.223372e+18) | uVar3) ^
          ((long)uVar1 >> 0x3f & (long)(fVar6 - 9.223372e+18) | uVar1) ^
         ((long)uVar2 >> 0x3f & (long)(fVar4 - 9.223372e+18) | uVar2)) % n;
}

Assistant:

size_t vx__vertex_hash(vx_vertex_t pos, size_t n)
{
    size_t a = (size_t)(pos.x * 73856093);
    size_t b = (size_t)(pos.y * 19349663);
    size_t c = (size_t)(pos.z * 83492791);

    return (a ^ b ^ c) % n;
}